

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O2

connectbundle * Curl_conncache_find_bundle(Curl_easy *data,connectdata *conn,conncache *connc)

{
  size_t key_len;
  connectbundle *pcVar1;
  conncache *extraout_RDX;
  conncache *len;
  char key [128];
  
  len = connc;
  if (data->share != (Curl_share *)0x0) {
    Curl_share_lock(data,CURL_LOCK_DATA_CONNECT,CURL_LOCK_ACCESS_SINGLE);
    len = extraout_RDX;
  }
  if (connc == (conncache *)0x0) {
    pcVar1 = (connectbundle *)0x0;
  }
  else {
    hashkey(conn,key,(size_t)len);
    key_len = strlen(key);
    pcVar1 = (connectbundle *)Curl_hash_pick(&connc->hash,key,key_len);
  }
  return pcVar1;
}

Assistant:

struct connectbundle *
Curl_conncache_find_bundle(struct Curl_easy *data,
                           struct connectdata *conn,
                           struct conncache *connc)
{
  struct connectbundle *bundle = NULL;
  CONNCACHE_LOCK(data);
  if(connc) {
    char key[HASHKEY_SIZE];
    hashkey(conn, key, sizeof(key));
    bundle = Curl_hash_pick(&connc->hash, key, strlen(key));
  }

  return bundle;
}